

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

CURLcode set_trace_config(GlobalConfig *global,char *token)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined1 local_68 [8];
  char buffer [32];
  size_t local_40;
  size_t len;
  char *pcStack_30;
  _Bool toggle;
  char *name;
  char *next;
  char *pcStack_18;
  CURLcode result;
  char *token_local;
  GlobalConfig *global_local;
  
  next._4_4_ = CURLE_OK;
  pcStack_18 = token;
  do {
    if (pcStack_18 == (char *)0x0) {
      return next._4_4_;
    }
    pcVar2 = strchr(pcStack_18,0x2c);
    if (pcVar2 == (char *)0x0) {
      local_40 = strlen(pcStack_18);
    }
    else {
      local_40 = (long)pcVar2 - (long)pcStack_18;
    }
    if (*pcStack_18 == '+') {
      len._7_1_ = 1;
      pcStack_30 = pcStack_18 + 1;
      local_40 = local_40 - 1;
    }
    else if (*pcStack_18 == '-') {
      len._7_1_ = 0;
      pcStack_30 = pcStack_18 + 1;
      local_40 = local_40 - 1;
    }
    else {
      len._7_1_ = 1;
      pcStack_30 = pcStack_18;
    }
    if ((local_40 == 3) && (iVar1 = curl_strnequal(pcStack_30,"all",3), iVar1 != 0)) {
      *(ushort *)&global->field_0x63 =
           *(ushort *)&global->field_0x63 & 0xffbf | (ushort)len._7_1_ << 6;
      *(ushort *)&global->field_0x63 =
           *(ushort *)&global->field_0x63 & 0xffdf | (ushort)len._7_1_ << 5;
      next._4_4_ = curl_global_trace(pcStack_18);
joined_r0x001152d3:
      if (next._4_4_ != CURLE_OK) {
        return next._4_4_;
      }
    }
    else if ((local_40 == 3) && (iVar1 = curl_strnequal(pcStack_30,"ids",3), iVar1 != 0)) {
      *(ushort *)&global->field_0x63 =
           *(ushort *)&global->field_0x63 & 0xffbf | (ushort)len._7_1_ << 6;
    }
    else {
      if ((local_40 != 4) || (iVar1 = curl_strnequal(pcStack_30,"time",4), iVar1 == 0)) {
        uVar3 = 0x2d;
        if (len._7_1_ != 0) {
          uVar3 = 0x2b;
        }
        curl_msnprintf(local_68,0x20,"%c%.*s",uVar3,local_40 & 0xffffffff,pcStack_30);
        next._4_4_ = curl_global_trace(local_68);
        goto joined_r0x001152d3;
      }
      *(ushort *)&global->field_0x63 =
           *(ushort *)&global->field_0x63 & 0xffdf | (ushort)len._7_1_ << 5;
    }
    name = pcVar2;
    if ((pcVar2 != (char *)0x0) && (name = pcVar2 + 1, *name == ' ')) {
      name = pcVar2 + 2;
    }
    pcStack_18 = name;
  } while( true );
}

Assistant:

static CURLcode set_trace_config(struct GlobalConfig *global,
                                 const char *token)
{
  CURLcode result = CURLE_OK;
  const char *next, *name;
  bool toggle;

  while(token) {
    size_t len;
    next = strchr(token, ',');

    if(next)
      len = next - token;
    else
      len = strlen(token);

    switch(*token) {
      case '-':
        toggle = FALSE;
        name = token + 1;
        len--;
        break;
      case '+':
        toggle = TRUE;
        name = token + 1;
        len--;
        break;
      default:
        toggle = TRUE;
        name = token;
        break;
    }

    if((len == 3) && strncasecompare(name, "all", 3)) {
      global->traceids = toggle;
      global->tracetime = toggle;
      result = curl_global_trace(token);
      if(result)
        goto out;
    }
    else if((len == 3) && strncasecompare(name, "ids", 3)) {
      global->traceids = toggle;
    }
    else if((len == 4) && strncasecompare(name, "time", 4)) {
      global->tracetime = toggle;
    }
    else {
      char buffer[32];
      msnprintf(buffer, sizeof(buffer), "%c%.*s", toggle ? '+' : '-',
                (int)len, name);
      result = curl_global_trace(buffer);
      if(result)
        goto out;
    }
    if(next) {
      next++;
      if(*next == ' ')
        next++;
    }
    token = next;
  }
out:
  return result;
}